

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O0

int __thiscall
asmjit::v1_14::BitVectorRangeIterator<unsigned_long,_0U>::init
          (BitVectorRangeIterator<unsigned_long,_0U> *this,EVP_PKEY_CTX *ctx)

{
  ulong in_RCX;
  ulong in_RDX;
  ulong in_R8;
  unsigned_long bitWord;
  unsigned_long *ptr;
  size_t idx;
  char *in_stack_00000380;
  int in_stack_0000038c;
  char *in_stack_00000390;
  ulong local_68;
  
  if (in_RDX < in_R8 + 0x3f >> 6) {
    DebugUtils::assertionFailed(in_stack_00000390,in_stack_0000038c,in_stack_00000380);
  }
  local_68 = 0;
  if ((in_RCX & 0xffffffffffffffc0) < in_R8) {
    local_68 = (*(ulong *)(ctx + (in_RCX >> 6) * 8) ^ 0xffffffffffffffff) &
               -1L << ((byte)in_RCX & 0x3f);
  }
  this->_ptr = (unsigned_long *)(ctx + (in_RCX >> 6) * 8);
  this->_idx = in_RCX & 0xffffffffffffffc0;
  this->_end = in_R8;
  this->_bitWord = local_68;
  return (int)this;
}

Assistant:

ASMJIT_FORCE_INLINE void init(const T* data, size_t numBitWords, size_t start, size_t end) noexcept {
    ASMJIT_ASSERT(numBitWords >= (end + kBitWordSize - 1) / kBitWordSize);
    DebugUtils::unused(numBitWords);

    size_t idx = Support::alignDown(start, kBitWordSize);
    const T* ptr = data + (idx / kBitWordSize);

    T bitWord = 0;
    if (idx < end)
      bitWord = (*ptr ^ kXorMask) & (Support::allOnes<T>() << (start % kBitWordSize));

    _ptr = ptr;
    _idx = idx;
    _end = end;
    _bitWord = bitWord;
  }